

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O0

void ghc::filesystem::create_directory_symlink(path *to,path *new_symlink)

{
  bool bVar1;
  int code;
  filesystem_error *this;
  error_code ec_00;
  string local_48;
  undefined1 auStack_28 [8];
  error_code ec;
  path *new_symlink_local;
  path *to_local;
  
  ec._M_cat = (error_category *)new_symlink;
  std::error_code::error_code((error_code *)auStack_28);
  create_directory_symlink(to,(path *)ec._M_cat,(error_code *)auStack_28);
  bVar1 = std::error_code::operator_cast_to_bool((error_code *)auStack_28);
  if (!bVar1) {
    return;
  }
  this = (filesystem_error *)__cxa_allocate_exception(0x90);
  code = std::error_code::value((error_code *)auStack_28);
  detail::systemErrorText<int>(&local_48,code);
  ec_00._0_8_ = (ulong)auStack_28 & 0xffffffff;
  ec_00._M_cat = (error_category *)ec._0_8_;
  filesystem_error::filesystem_error(this,&local_48,to,(path *)ec._M_cat,ec_00);
  __cxa_throw(this,&filesystem_error::typeinfo,filesystem_error::~filesystem_error);
}

Assistant:

GHC_INLINE void create_directory_symlink(const path& to, const path& new_symlink)
{
    std::error_code ec;
    create_directory_symlink(to, new_symlink, ec);
    if (ec) {
        throw filesystem_error(detail::systemErrorText(ec.value()), to, new_symlink, ec);
    }
}